

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall
TSMuxer::setMasterMode(TSMuxer *this,AbstractMuxer *subMuxer,bool flushInterleavedBlock)

{
  uint in_EAX;
  undefined8 uStack_8;
  
  if ((subMuxer == (AbstractMuxer *)0x0) ||
     (in_EAX = 0x24c678, subMuxer->_vptr_AbstractMuxer != (_func_int **)&PTR__TSMuxer_0024c678)) {
    subMuxer = (AbstractMuxer *)0x0;
  }
  this->m_sublingMuxer = (TSMuxer *)subMuxer;
  this->m_masterMode = true;
  this->m_canSwithBlock = flushInterleavedBlock;
  uStack_8 = (ulong)in_EAX;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((this->m_interleaveInfo).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1,(int *)((long)&uStack_8 + 4));
  return;
}

Assistant:

void TSMuxer::setMasterMode(AbstractMuxer* subMuxer, const bool flushInterleavedBlock)
{
    m_sublingMuxer = dynamic_cast<TSMuxer*>(subMuxer);
    m_masterMode = true;
    m_canSwithBlock = flushInterleavedBlock;
    m_interleaveInfo.rbegin()->push_back(0);
}